

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gotcha.c
# Opt level: O0

int find_relro_boundary(dl_phdr_info *info,size_t size,void *data)

{
  bool bVar1;
  int iVar2;
  int local_3c;
  int local_38;
  int i_1;
  int i;
  int found;
  Boundary *boundary;
  void *data_local;
  size_t size_local;
  dl_phdr_info *info_local;
  
  bVar1 = false;
  local_38 = 0;
  do {
    if ((int)(uint)info->dlpi_phnum <= local_38) {
LAB_004827d3:
      if (bVar1) {
        for (local_3c = 0; local_3c < (int)(uint)info->dlpi_phnum; local_3c = local_3c + 1) {
          if (info->dlpi_phdr[local_3c].p_type == 0x6474e552) {
            *(Elf64_Addr *)((long)data + 0x10) =
                 *(long *)((long)data + 8) + info->dlpi_phdr[local_3c].p_vaddr;
            *(Elf64_Xword *)((long)data + 0x18) =
                 *(long *)((long)data + 0x10) + info->dlpi_phdr[local_3c].p_memsz;
            *(undefined4 *)((long)data + 0x20) = 1;
            return 1;
          }
        }
      }
      return 0;
    }
    if (((info->dlpi_phdr[local_38].p_type == 1) &&
        (iVar2 = strcmp(*data,info->dlpi_name), iVar2 == 0)) &&
       (*(Elf64_Addr *)((long)data + 8) == info->dlpi_addr)) {
      bVar1 = true;
      goto LAB_004827d3;
    }
    local_38 = local_38 + 1;
  } while( true );
}

Assistant:

int find_relro_boundary(struct dl_phdr_info *info, size_t size, void *data) {
  struct Boundary *boundary = data;
  int found = 0;
  for (int i = 0; i < info->dlpi_phnum; ++i) {
    if (info->dlpi_phdr[i].p_type == PT_LOAD) {
      if (strcmp(boundary->l_name, info->dlpi_name) == 0 &&
          boundary->load_addr == info->dlpi_addr) {
        found = 1;
        break;
      }
    }
  }
  if (found) {
    for (int i = 0; i < info->dlpi_phnum; ++i) {
      if (info->dlpi_phdr[i].p_type == PT_GNU_RELRO) {
        boundary->start_addr = boundary->load_addr + info->dlpi_phdr[i].p_vaddr;
        boundary->end_addr = boundary->start_addr + info->dlpi_phdr[i].p_memsz;
        boundary->found = 1;
        return 1;
      }
    }
  }
  return 0;
}